

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CheckboxFlags(char *label,uint *flags,uint flags_value)

{
  uint uVar1;
  bool bVar2;
  uint in_EDX;
  uint *in_RSI;
  bool pressed;
  bool v;
  bool *in_stack_00000110;
  char *in_stack_00000118;
  
  uVar1 = *in_RSI;
  bVar2 = Checkbox(in_stack_00000118,in_stack_00000110);
  if (bVar2) {
    if ((uVar1 & in_EDX) == in_EDX) {
      *in_RSI = in_EDX | *in_RSI;
    }
    else {
      *in_RSI = (in_EDX ^ 0xffffffff) & *in_RSI;
    }
  }
  return bVar2;
}

Assistant:

bool ImGui::CheckboxFlags(const char* label, unsigned int* flags, unsigned int flags_value)
{
    bool v = ((*flags & flags_value) == flags_value);
    bool pressed = Checkbox(label, &v);
    if (pressed)
    {
        if (v)
            *flags |= flags_value;
        else
            *flags &= ~flags_value;
    }

    return pressed;
}